

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O0

void duckdb::ExpressionIterator::EnumerateChildren
               (Expression *expr,function<void_(duckdb::Expression_&)> *callback)

{
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
  *in_stack_000001a8;
  Expression *in_stack_000001b0;
  anon_class_8_1_dda845c3 *in_stack_ffffffffffffffb8;
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
  *in_stack_ffffffffffffffc0;
  
  ::std::
  function<void(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>&)>
  ::
  function<duckdb::ExpressionIterator::EnumerateChildren(duckdb::Expression&,std::function<void(duckdb::Expression&)>const&)::__0,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  EnumerateChildren(in_stack_000001b0,in_stack_000001a8);
  std::
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
  ::~function((function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
               *)0xe6ea1f);
  return;
}

Assistant:

void ExpressionIterator::EnumerateChildren(Expression &expr, const std::function<void(Expression &child)> &callback) {
	EnumerateChildren(expr, [&](unique_ptr<Expression> &child) { callback(*child); });
}